

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_out_prod(ggml_compute_params *params,ggml_tensor *dst)

{
  ulong uVar1;
  void *pvVar2;
  int *piVar3;
  uint *puVar4;
  ggml_type gVar5;
  int iVar6;
  int iVar7;
  ggml_tensor *pgVar8;
  ggml_tensor *pgVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  code *pcVar24;
  void *pvVar25;
  void *pvVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  byte bVar41;
  byte bVar42;
  long lVar43;
  size_t sVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  long lVar52;
  void *pvVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  char *pcVar58;
  int j;
  uint uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  int i;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  ulong uVar69;
  undefined8 uVar70;
  long lVar71;
  long lVar72;
  ulong uVar73;
  ulong uVar74;
  uint uVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  ushort uVar80;
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  float *v [32];
  float *x [32];
  __m512 vx [32];
  long local_be8;
  undefined8 auStack_a80 [32];
  long alStack_980 [32];
  undefined1 auStack_880 [2128];
  
  pgVar8 = dst->src[0];
  gVar5 = pgVar8->type;
  uVar60 = (ulong)gVar5;
  if (uVar60 < 0x24) {
    if ((0xc20ff7dccU >> (uVar60 & 0x3f) & 1) != 0) {
      pgVar9 = dst->src[1];
      lVar10 = pgVar8->ne[0];
      sVar11 = pgVar8->nb[0];
      lVar12 = pgVar8->ne[1];
      lVar76 = pgVar8->ne[2];
      lVar65 = pgVar8->ne[3];
      lVar45 = dst->ne[2];
      lVar78 = pgVar9->ne[0];
      sVar13 = pgVar8->nb[2];
      sVar14 = pgVar8->nb[1];
      sVar15 = pgVar8->nb[3];
      lVar52 = pgVar9->ne[2];
      sVar16 = pgVar9->nb[0];
      lVar72 = pgVar9->ne[3];
      sVar17 = pgVar9->nb[2];
      sVar18 = pgVar9->nb[1];
      lVar46 = dst->ne[0];
      sVar19 = pgVar9->nb[3];
      lVar47 = dst->ne[3];
      lVar54 = dst->ne[1];
      sVar20 = dst->nb[1];
      sVar21 = dst->nb[0];
      sVar22 = dst->nb[3];
      sVar23 = dst->nb[2];
      iVar6 = params->ith;
      iVar7 = params->nth;
      lVar43 = ggml_get_type_traits(uVar60);
      if (lVar76 == lVar52) {
        if (lVar65 == lVar72) {
          if (lVar45 == lVar76) {
            if (lVar47 == lVar65) {
              pcVar24 = *(code **)(lVar43 + 0x28);
              sVar44 = ggml_type_size(gVar5);
              if (sVar11 == sVar44) {
                if (sVar21 == 4) {
                  if (lVar46 == lVar10) {
                    if (lVar54 == lVar78) {
                      lVar76 = lVar76 * lVar78;
                      uVar75 = (uint)lVar10;
                      if ((iVar6 == 0) &&
                         (uVar59 = (int)lVar65 * uVar75 * (int)lVar76, 0 < (int)uVar59)) {
                        memset(dst->data,0,(ulong)(uVar59 & 0x7fffffff) << 2);
                      }
                      ggml_barrier(params->threadpool);
                      lVar65 = lVar65 * lVar76;
                      lVar45 = (lVar65 + -1 + (long)iVar7) / (long)iVar7;
                      local_be8 = lVar45 * iVar6;
                      lVar45 = lVar45 + local_be8;
                      if (lVar65 <= lVar45) {
                        lVar45 = lVar65;
                      }
                      if (local_be8 < lVar45) {
                        pvVar25 = params->wdata;
                        uVar59 = uVar75 & 0xffffffc0;
                        lVar72 = (long)(int)uVar59;
                        lVar52 = (lVar10 + 0x10) * (long)iVar6;
                        lVar65 = (long)(int)uVar75;
                        if ((long)(int)uVar75 < lVar72 + 1) {
                          lVar65 = lVar72 + 1;
                        }
                        pvVar2 = (void *)((long)pvVar25 + lVar52 * 4);
                        auVar81 = vpbroadcastq_avx512f();
                        auVar81 = vmovdqa64_avx512f(auVar81);
                        do {
                          if (0 < lVar12) {
                            lVar46 = local_be8 / lVar76;
                            lVar47 = (local_be8 % lVar76) / lVar78;
                            lVar43 = (local_be8 % lVar76) % lVar78;
                            lVar54 = 0;
                            lVar66 = lVar46 * sVar22 + lVar43 * sVar20 + lVar47 * sVar23;
                            do {
                              pvVar53 = pgVar9->data;
                              pvVar26 = dst->data;
                              (*pcVar24)((long)pgVar8->data +
                                         lVar46 * sVar15 + lVar47 * sVar13 + lVar54 * sVar14,pvVar2,
                                         lVar10);
                              auVar82 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                              auVar83 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                              auVar84 = vmovdqa64_avx512f(auVar81);
                              auVar85 = vbroadcastss_avx512f
                                                  (ZEXT416(*(uint *)((long)pvVar53 +
                                                                    lVar46 * sVar19 +
                                                                    lVar54 * sVar18 +
                                                                    lVar47 * sVar17 +
                                                                    lVar43 * sVar16)));
                              if (0 < (int)uVar59) {
                                uVar60 = 0;
                                lVar48 = lVar66 + (long)pvVar26;
                                pvVar53 = pvVar2;
                                do {
                                  lVar67 = 0;
                                  do {
                                    auVar86 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                   ((long)pvVar53 + lVar67),auVar85,
                                                                  *(undefined1 (*) [64])
                                                                   (lVar48 + lVar67));
                                    *(undefined1 (*) [64])(lVar48 + lVar67) = auVar86;
                                    lVar67 = lVar67 + 0x40;
                                  } while (lVar67 != 0x100);
                                  uVar60 = uVar60 + 0x40;
                                  lVar48 = lVar48 + 0x100;
                                  pvVar53 = (void *)((long)pvVar53 + 0x100);
                                } while (uVar60 < uVar59);
                              }
                              if (uVar59 != uVar75) {
                                auVar85 = vbroadcastss_avx512f(auVar85._0_16_);
                                uVar60 = 0;
                                lVar48 = lVar66 + lVar72 * 4;
                                do {
                                  auVar86 = vpbroadcastq_avx512f();
                                  auVar87 = vporq_avx512f(auVar86,auVar83);
                                  auVar86 = vporq_avx512f(auVar86,auVar82);
                                  uVar70 = vpcmpuq_avx512f(auVar86,auVar84,2);
                                  bVar41 = (byte)uVar70;
                                  uVar70 = vpcmpuq_avx512f(auVar87,auVar84,2);
                                  bVar42 = (byte)uVar70;
                                  uVar80 = CONCAT11(bVar42,bVar41);
                                  piVar3 = (int *)((long)pvVar25 +
                                                  uVar60 * 4 + lVar72 * 4 + lVar52 * 4);
                                  auVar86._4_4_ = (uint)((byte)(uVar80 >> 1) & 1) * piVar3[1];
                                  auVar86._0_4_ = (uint)(bVar41 & 1) * *piVar3;
                                  auVar86._8_4_ = (uint)((byte)(uVar80 >> 2) & 1) * piVar3[2];
                                  auVar86._12_4_ = (uint)((byte)(uVar80 >> 3) & 1) * piVar3[3];
                                  auVar86._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * piVar3[4];
                                  auVar86._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * piVar3[5];
                                  auVar86._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * piVar3[6];
                                  auVar86._28_4_ = (uint)((byte)(uVar80 >> 7) & 1) * piVar3[7];
                                  auVar86._32_4_ = (uint)(bVar42 & 1) * piVar3[8];
                                  auVar86._36_4_ = (uint)(bVar42 >> 1 & 1) * piVar3[9];
                                  auVar86._40_4_ = (uint)(bVar42 >> 2 & 1) * piVar3[10];
                                  auVar86._44_4_ = (uint)(bVar42 >> 3 & 1) * piVar3[0xb];
                                  auVar86._48_4_ = (uint)(bVar42 >> 4 & 1) * piVar3[0xc];
                                  auVar86._52_4_ = (uint)(bVar42 >> 5 & 1) * piVar3[0xd];
                                  auVar86._56_4_ = (uint)(bVar42 >> 6 & 1) * piVar3[0xe];
                                  auVar86._60_4_ = (uint)(bVar42 >> 7) * piVar3[0xf];
                                  piVar3 = (int *)((long)pvVar26 + uVar60 * 4 + lVar48);
                                  auVar87._4_4_ = (uint)((byte)(uVar80 >> 1) & 1) * piVar3[1];
                                  auVar87._0_4_ = (uint)(bVar41 & 1) * *piVar3;
                                  auVar87._8_4_ = (uint)((byte)(uVar80 >> 2) & 1) * piVar3[2];
                                  auVar87._12_4_ = (uint)((byte)(uVar80 >> 3) & 1) * piVar3[3];
                                  auVar87._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * piVar3[4];
                                  auVar87._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * piVar3[5];
                                  auVar87._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * piVar3[6];
                                  auVar87._28_4_ = (uint)((byte)(uVar80 >> 7) & 1) * piVar3[7];
                                  auVar87._32_4_ = (uint)(bVar42 & 1) * piVar3[8];
                                  auVar87._36_4_ = (uint)(bVar42 >> 1 & 1) * piVar3[9];
                                  auVar87._40_4_ = (uint)(bVar42 >> 2 & 1) * piVar3[10];
                                  auVar87._44_4_ = (uint)(bVar42 >> 3 & 1) * piVar3[0xb];
                                  auVar87._48_4_ = (uint)(bVar42 >> 4 & 1) * piVar3[0xc];
                                  auVar87._52_4_ = (uint)(bVar42 >> 5 & 1) * piVar3[0xd];
                                  auVar87._56_4_ = (uint)(bVar42 >> 6 & 1) * piVar3[0xe];
                                  auVar87._60_4_ = (uint)(bVar42 >> 7) * piVar3[0xf];
                                  auVar86 = vfmadd231ps_avx512f(auVar87,auVar85,auVar86);
                                  puVar4 = (uint *)((long)pvVar26 + uVar60 * 4 + lVar48);
                                  bVar28 = (bool)((byte)(uVar80 >> 1) & 1);
                                  bVar29 = (bool)((byte)(uVar80 >> 2) & 1);
                                  bVar30 = (bool)((byte)(uVar80 >> 3) & 1);
                                  bVar31 = (bool)((byte)(uVar80 >> 4) & 1);
                                  bVar32 = (bool)((byte)(uVar80 >> 5) & 1);
                                  bVar33 = (bool)((byte)(uVar80 >> 6) & 1);
                                  bVar34 = (bool)((byte)(uVar80 >> 7) & 1);
                                  bVar35 = (bool)(bVar42 >> 1 & 1);
                                  bVar36 = (bool)(bVar42 >> 2 & 1);
                                  bVar37 = (bool)(bVar42 >> 3 & 1);
                                  bVar38 = (bool)(bVar42 >> 4 & 1);
                                  bVar39 = (bool)(bVar42 >> 5 & 1);
                                  bVar40 = (bool)(bVar42 >> 6 & 1);
                                  *puVar4 = (uint)(bVar41 & 1) * auVar86._0_4_ |
                                            (uint)!(bool)(bVar41 & 1) * *puVar4;
                                  puVar4[1] = (uint)bVar28 * auVar86._4_4_ |
                                              (uint)!bVar28 * puVar4[1];
                                  puVar4[2] = (uint)bVar29 * auVar86._8_4_ |
                                              (uint)!bVar29 * puVar4[2];
                                  puVar4[3] = (uint)bVar30 * auVar86._12_4_ |
                                              (uint)!bVar30 * puVar4[3];
                                  puVar4[4] = (uint)bVar31 * auVar86._16_4_ |
                                              (uint)!bVar31 * puVar4[4];
                                  puVar4[5] = (uint)bVar32 * auVar86._20_4_ |
                                              (uint)!bVar32 * puVar4[5];
                                  puVar4[6] = (uint)bVar33 * auVar86._24_4_ |
                                              (uint)!bVar33 * puVar4[6];
                                  puVar4[7] = (uint)bVar34 * auVar86._28_4_ |
                                              (uint)!bVar34 * puVar4[7];
                                  puVar4[8] = (uint)(bVar42 & 1) * auVar86._32_4_ |
                                              (uint)!(bool)(bVar42 & 1) * puVar4[8];
                                  puVar4[9] = (uint)bVar35 * auVar86._36_4_ |
                                              (uint)!bVar35 * puVar4[9];
                                  puVar4[10] = (uint)bVar36 * auVar86._40_4_ |
                                               (uint)!bVar36 * puVar4[10];
                                  puVar4[0xb] = (uint)bVar37 * auVar86._44_4_ |
                                                (uint)!bVar37 * puVar4[0xb];
                                  puVar4[0xc] = (uint)bVar38 * auVar86._48_4_ |
                                                (uint)!bVar38 * puVar4[0xc];
                                  puVar4[0xd] = (uint)bVar39 * auVar86._52_4_ |
                                                (uint)!bVar39 * puVar4[0xd];
                                  puVar4[0xe] = (uint)bVar40 * auVar86._56_4_ |
                                                (uint)!bVar40 * puVar4[0xe];
                                  puVar4[0xf] = (uint)(bVar42 >> 7) * auVar86._60_4_ |
                                                (uint)!(bool)(bVar42 >> 7) * puVar4[0xf];
                                  uVar60 = uVar60 + 0x10;
                                } while (((lVar65 - lVar72) + 0xfU & 0xfffffffffffffff0) != uVar60);
                              }
                              lVar54 = lVar54 + 1;
                            } while (lVar54 != lVar12);
                          }
                          local_be8 = local_be8 + 1;
                        } while (local_be8 != lVar45);
                      }
                      return;
                    }
                    pcVar58 = "ne1 == ne10";
                    uVar70 = 0xe94;
                  }
                  else {
                    pcVar58 = "ne0 == ne00";
                    uVar70 = 0xe93;
                  }
                }
                else {
                  pcVar58 = "nb0 == sizeof(float)";
                  uVar70 = 0xe8e;
                }
              }
              else {
                pcVar58 = "nb00 == ggml_type_size(type)";
                uVar70 = 0xe8b;
              }
            }
            else {
              pcVar58 = "ne3 == ne13";
              uVar70 = 0xe88;
            }
          }
          else {
            pcVar58 = "ne2 == ne12";
            uVar70 = 0xe87;
          }
        }
        else {
          pcVar58 = "ne03 == ne13";
          uVar70 = 0xe86;
        }
      }
      else {
        pcVar58 = "ne02 == ne12";
        uVar70 = 0xe85;
      }
LAB_0013c11f:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,uVar70,"GGML_ASSERT(%s) failed",pcVar58);
    }
    if (uVar60 == 0) {
      if (dst->type == GGML_TYPE_F32) {
        pgVar9 = dst->src[1];
        if (pgVar9->type == GGML_TYPE_F32) {
          if (dst->ne[0] == pgVar8->ne[0]) {
            lVar10 = pgVar9->ne[0];
            if (dst->ne[1] == lVar10) {
              lVar12 = pgVar9->ne[2];
              if (dst->ne[2] == lVar12) {
                lVar76 = pgVar9->ne[3];
                if (dst->ne[3] == lVar76) {
                  lVar65 = pgVar8->ne[2];
                  if (lVar12 % lVar65 == 0) {
                    lVar45 = pgVar8->ne[3];
                    if (lVar76 % lVar45 == 0) {
                      if (pgVar8->nb[0] == 4) {
                        if (dst->nb[0] == 4) {
                          sVar11 = pgVar8->nb[1];
                          uVar60 = pgVar8->ne[1];
                          sVar13 = pgVar8->nb[2];
                          lVar78 = lVar12 * lVar10;
                          sVar14 = pgVar8->nb[3];
                          sVar15 = pgVar9->nb[0];
                          sVar16 = pgVar9->nb[2];
                          sVar17 = pgVar9->nb[1];
                          sVar18 = dst->nb[1];
                          sVar19 = pgVar9->nb[3];
                          sVar20 = dst->nb[3];
                          sVar21 = dst->nb[2];
                          iVar6 = params->ith;
                          iVar7 = params->nth;
                          uVar75 = (uint)pgVar8->ne[0];
                          if ((iVar6 == 0) &&
                             (uVar59 = (int)lVar78 * uVar75 * (int)lVar76, 0 < (int)uVar59)) {
                            memset(dst->data,0,(ulong)(uVar59 & 0x7fffffff) << 2);
                          }
                          ggml_barrier(params->threadpool);
                          lVar46 = lVar76 * lVar78;
                          lVar52 = (lVar46 + -1 + (long)iVar7) / (long)iVar7;
                          lVar72 = iVar6 * lVar52;
                          lVar52 = lVar52 + lVar72;
                          if (lVar46 <= lVar52) {
                            lVar52 = lVar46;
                          }
                          if (lVar52 <= lVar72) {
                            return;
                          }
                          uVar59 = uVar75 & 0xffffffc0;
                          uVar79 = (ulong)uVar59;
                          auVar81 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          auVar82 = vpbroadcastq_avx512f(ZEXT816(8));
                          auVar83 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                          auVar84 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          lVar47 = (long)(int)uVar75;
                          uVar73 = (ulong)(int)uVar59;
                          lVar46 = uVar73 + 1;
                          if ((long)(uVar73 + 1) <= lVar47) {
                            lVar46 = lVar47;
                          }
                          auVar85 = vpbroadcastq_avx512f();
                          auVar86 = vpbroadcastq_avx512f();
                          auVar87 = vpbroadcastq_avx512f();
                          do {
                            lVar54 = lVar72 + 0x10;
                            lVar43 = lVar52;
                            if (lVar54 < lVar52) {
                              lVar43 = lVar54;
                            }
                            if (0 < (long)uVar60) {
                              uVar49 = 0x20;
                              uVar55 = 0;
                              do {
                                uVar1 = uVar55 + 0x20;
                                uVar50 = uVar49;
                                if ((long)uVar60 < (long)uVar49) {
                                  uVar50 = uVar60;
                                }
                                lVar66 = (uVar50 >> 5 & 0x3ffffffffffffff) * sVar11 * 0x20;
                                uVar50 = uVar60;
                                if ((long)uVar1 < (long)uVar60) {
                                  uVar50 = uVar1;
                                }
                                uVar61 = uVar50 & 0x7fffffffffffffe0;
                                lVar48 = lVar72;
                                do {
                                  lVar67 = lVar48 / lVar78;
                                  lVar51 = (lVar48 % lVar78) / lVar10;
                                  lVar62 = (lVar48 % lVar78) % lVar10;
                                  if (uVar55 < uVar61) {
                                    lVar68 = lVar62 * sVar18;
                                    lVar63 = lVar51 * sVar21;
                                    lVar71 = lVar67 * sVar20;
                                    uVar69 = uVar55;
                                    do {
                                      pvVar25 = dst->data;
                                      auVar88 = vmovdqa64_avx512f(auVar81);
                                      auVar89 = vpbroadcastq_avx512f();
                                      lVar64 = 0;
                                      auVar90 = vpbroadcastq_avx512f();
                                      do {
                                        auVar91 = vpmullq_avx512dq(auVar88,auVar86);
                                        auVar92 = vpmullq_avx512dq(auVar88,auVar85);
                                        auVar88 = vpaddq_avx512f(auVar88,auVar82);
                                        auVar91 = vpaddq_avx512f(auVar89,auVar91);
                                        auVar91 = vmovdqu64_avx512f(auVar91);
                                        *(undefined1 (*) [64])(alStack_980 + lVar64) = auVar91;
                                        auVar91 = vpaddq_avx512f(auVar90,auVar92);
                                        auVar91 = vmovdqu64_avx512f(auVar91);
                                        *(undefined1 (*) [64])(auStack_a80 + lVar64) = auVar91;
                                        lVar64 = lVar64 + 8;
                                      } while (lVar64 != 0x20);
                                      lVar64 = 0;
                                      do {
                                        auVar88 = vbroadcastss_avx512f
                                                            (ZEXT416(**(uint **)((long)auStack_a80 +
                                                                                lVar64)));
                                        *(undefined1 (*) [64])(auStack_880 + lVar64 * 8) = auVar88;
                                        lVar64 = lVar64 + 8;
                                      } while (lVar64 != 0x100);
                                      uVar57 = uVar73;
                                      if (0 < (int)uVar59) {
                                        uVar74 = 0;
                                        do {
                                          lVar64 = uVar74 * 4 + lVar71 + lVar63 + lVar68;
                                          lVar77 = 0;
                                          do {
                                            auVar88 = *(undefined1 (*) [64])
                                                       ((long)pvVar25 + lVar77 * 0x40 + lVar64);
                                            lVar56 = 0;
                                            do {
                                              auVar88 = vfmadd231ps_avx512f(auVar88,*(undefined1
                                                                                      (*) [64])
                                                                                     (uVar74 * 4 +
                                                                                      *(long *)((
                                                  long)alStack_980 + lVar56) + lVar77 * 0x40),
                                                  *(undefined1 (*) [64])(auStack_880 + lVar56 * 8));
                                              lVar56 = lVar56 + 8;
                                            } while (lVar56 != 0x100);
                                            lVar56 = lVar77 + 1;
                                            *(undefined1 (*) [64])
                                             ((long)pvVar25 + lVar77 * 0x40 + lVar64) = auVar88;
                                            lVar77 = lVar56;
                                          } while (lVar56 != 4);
                                          uVar74 = uVar74 + 0x40;
                                          uVar57 = uVar79;
                                        } while (uVar74 < uVar79);
                                      }
                                      lVar64 = uVar57 + 1;
                                      if ((long)(uVar57 + 1) <= lVar47) {
                                        lVar64 = lVar47;
                                      }
                                      lVar56 = 0;
                                      auVar88 = vpbroadcastq_avx512f();
                                      lVar77 = uVar57 * 4 + lVar68 + lVar71 + lVar63;
                                      do {
                                        if (uVar59 != uVar75) {
                                          lVar27 = alStack_980[lVar56];
                                          uVar74 = 0;
                                          auVar89 = vbroadcastss_avx512f
                                                              (ZEXT416(*(uint *)auStack_a80[lVar56])
                                                              );
                                          do {
                                            auVar90 = vpbroadcastq_avx512f();
                                            auVar91 = vporq_avx512f(auVar90,auVar83);
                                            auVar90 = vporq_avx512f(auVar90,auVar84);
                                            uVar70 = vpcmpuq_avx512f(auVar90,auVar88,2);
                                            bVar41 = (byte)uVar70;
                                            uVar70 = vpcmpuq_avx512f(auVar91,auVar88,2);
                                            bVar42 = (byte)uVar70;
                                            uVar80 = CONCAT11(bVar42,bVar41);
                                            piVar3 = (int *)(lVar27 + uVar57 * 4 + uVar74 * 4);
                                            auVar90._4_4_ =
                                                 (uint)((byte)(uVar80 >> 1) & 1) * piVar3[1];
                                            auVar90._0_4_ = (uint)(bVar41 & 1) * *piVar3;
                                            auVar90._8_4_ =
                                                 (uint)((byte)(uVar80 >> 2) & 1) * piVar3[2];
                                            auVar90._12_4_ =
                                                 (uint)((byte)(uVar80 >> 3) & 1) * piVar3[3];
                                            auVar90._16_4_ =
                                                 (uint)((byte)(uVar80 >> 4) & 1) * piVar3[4];
                                            auVar90._20_4_ =
                                                 (uint)((byte)(uVar80 >> 5) & 1) * piVar3[5];
                                            auVar90._24_4_ =
                                                 (uint)((byte)(uVar80 >> 6) & 1) * piVar3[6];
                                            auVar90._28_4_ =
                                                 (uint)((byte)(uVar80 >> 7) & 1) * piVar3[7];
                                            auVar90._32_4_ = (uint)(bVar42 & 1) * piVar3[8];
                                            auVar90._36_4_ = (uint)(bVar42 >> 1 & 1) * piVar3[9];
                                            auVar90._40_4_ = (uint)(bVar42 >> 2 & 1) * piVar3[10];
                                            auVar90._44_4_ = (uint)(bVar42 >> 3 & 1) * piVar3[0xb];
                                            auVar90._48_4_ = (uint)(bVar42 >> 4 & 1) * piVar3[0xc];
                                            auVar90._52_4_ = (uint)(bVar42 >> 5 & 1) * piVar3[0xd];
                                            auVar90._56_4_ = (uint)(bVar42 >> 6 & 1) * piVar3[0xe];
                                            auVar90._60_4_ = (uint)(bVar42 >> 7) * piVar3[0xf];
                                            piVar3 = (int *)((long)pvVar25 + uVar74 * 4 + lVar77);
                                            auVar91._4_4_ =
                                                 (uint)((byte)(uVar80 >> 1) & 1) * piVar3[1];
                                            auVar91._0_4_ = (uint)(bVar41 & 1) * *piVar3;
                                            auVar91._8_4_ =
                                                 (uint)((byte)(uVar80 >> 2) & 1) * piVar3[2];
                                            auVar91._12_4_ =
                                                 (uint)((byte)(uVar80 >> 3) & 1) * piVar3[3];
                                            auVar91._16_4_ =
                                                 (uint)((byte)(uVar80 >> 4) & 1) * piVar3[4];
                                            auVar91._20_4_ =
                                                 (uint)((byte)(uVar80 >> 5) & 1) * piVar3[5];
                                            auVar91._24_4_ =
                                                 (uint)((byte)(uVar80 >> 6) & 1) * piVar3[6];
                                            auVar91._28_4_ =
                                                 (uint)((byte)(uVar80 >> 7) & 1) * piVar3[7];
                                            auVar91._32_4_ = (uint)(bVar42 & 1) * piVar3[8];
                                            auVar91._36_4_ = (uint)(bVar42 >> 1 & 1) * piVar3[9];
                                            auVar91._40_4_ = (uint)(bVar42 >> 2 & 1) * piVar3[10];
                                            auVar91._44_4_ = (uint)(bVar42 >> 3 & 1) * piVar3[0xb];
                                            auVar91._48_4_ = (uint)(bVar42 >> 4 & 1) * piVar3[0xc];
                                            auVar91._52_4_ = (uint)(bVar42 >> 5 & 1) * piVar3[0xd];
                                            auVar91._56_4_ = (uint)(bVar42 >> 6 & 1) * piVar3[0xe];
                                            auVar91._60_4_ = (uint)(bVar42 >> 7) * piVar3[0xf];
                                            auVar90 = vfmadd231ps_avx512f(auVar91,auVar89,auVar90);
                                            puVar4 = (uint *)((long)pvVar25 + uVar74 * 4 + lVar77);
                                            bVar28 = (bool)((byte)(uVar80 >> 1) & 1);
                                            bVar29 = (bool)((byte)(uVar80 >> 2) & 1);
                                            bVar30 = (bool)((byte)(uVar80 >> 3) & 1);
                                            bVar31 = (bool)((byte)(uVar80 >> 4) & 1);
                                            bVar32 = (bool)((byte)(uVar80 >> 5) & 1);
                                            bVar33 = (bool)((byte)(uVar80 >> 6) & 1);
                                            bVar34 = (bool)((byte)(uVar80 >> 7) & 1);
                                            bVar35 = (bool)(bVar42 >> 1 & 1);
                                            bVar36 = (bool)(bVar42 >> 2 & 1);
                                            bVar37 = (bool)(bVar42 >> 3 & 1);
                                            bVar38 = (bool)(bVar42 >> 4 & 1);
                                            bVar39 = (bool)(bVar42 >> 5 & 1);
                                            bVar40 = (bool)(bVar42 >> 6 & 1);
                                            *puVar4 = (uint)(bVar41 & 1) * auVar90._0_4_ |
                                                      (uint)!(bool)(bVar41 & 1) * *puVar4;
                                            puVar4[1] = (uint)bVar28 * auVar90._4_4_ |
                                                        (uint)!bVar28 * puVar4[1];
                                            puVar4[2] = (uint)bVar29 * auVar90._8_4_ |
                                                        (uint)!bVar29 * puVar4[2];
                                            puVar4[3] = (uint)bVar30 * auVar90._12_4_ |
                                                        (uint)!bVar30 * puVar4[3];
                                            puVar4[4] = (uint)bVar31 * auVar90._16_4_ |
                                                        (uint)!bVar31 * puVar4[4];
                                            puVar4[5] = (uint)bVar32 * auVar90._20_4_ |
                                                        (uint)!bVar32 * puVar4[5];
                                            puVar4[6] = (uint)bVar33 * auVar90._24_4_ |
                                                        (uint)!bVar33 * puVar4[6];
                                            puVar4[7] = (uint)bVar34 * auVar90._28_4_ |
                                                        (uint)!bVar34 * puVar4[7];
                                            puVar4[8] = (uint)(bVar42 & 1) * auVar90._32_4_ |
                                                        (uint)!(bool)(bVar42 & 1) * puVar4[8];
                                            puVar4[9] = (uint)bVar35 * auVar90._36_4_ |
                                                        (uint)!bVar35 * puVar4[9];
                                            puVar4[10] = (uint)bVar36 * auVar90._40_4_ |
                                                         (uint)!bVar36 * puVar4[10];
                                            puVar4[0xb] = (uint)bVar37 * auVar90._44_4_ |
                                                          (uint)!bVar37 * puVar4[0xb];
                                            puVar4[0xc] = (uint)bVar38 * auVar90._48_4_ |
                                                          (uint)!bVar38 * puVar4[0xc];
                                            puVar4[0xd] = (uint)bVar39 * auVar90._52_4_ |
                                                          (uint)!bVar39 * puVar4[0xd];
                                            puVar4[0xe] = (uint)bVar40 * auVar90._56_4_ |
                                                          (uint)!bVar40 * puVar4[0xe];
                                            puVar4[0xf] = (uint)(bVar42 >> 7) * auVar90._60_4_ |
                                                          (uint)!(bool)(bVar42 >> 7) * puVar4[0xf];
                                            uVar74 = uVar74 + 0x10;
                                          } while (((lVar64 - uVar57) + 0xf & 0xfffffffffffffff0) !=
                                                   uVar74);
                                        }
                                        lVar56 = lVar56 + 1;
                                      } while (lVar56 != 0x20);
                                      uVar69 = uVar69 + 0x20;
                                    } while (uVar69 < uVar61);
                                  }
                                  if ((long)uVar61 < (long)uVar50) {
                                    lVar63 = (lVar67 / (lVar76 / lVar45)) * sVar14;
                                    lVar68 = (lVar51 / (lVar12 / lVar65)) * sVar13;
                                    lVar71 = lVar67 * sVar20 + lVar62 * sVar18 + lVar51 * sVar21;
                                    lVar64 = lVar66 + lVar63 + lVar68;
                                    lVar68 = lVar63 + uVar73 * 4 + lVar66 + lVar68;
                                    uVar69 = uVar61;
                                    do {
                                      pvVar25 = dst->data;
                                      pvVar2 = pgVar8->data;
                                      auVar88 = vbroadcastss_avx512f
                                                          (ZEXT416(*(uint *)((long)pgVar9->data +
                                                                            lVar67 * sVar19 +
                                                                            lVar51 * sVar16 +
                                                                            uVar69 * sVar17 +
                                                                            lVar62 * sVar15)));
                                      if (0 < (int)uVar59) {
                                        lVar63 = (long)pvVar25 + lVar71;
                                        lVar77 = (long)pvVar2 + lVar64;
                                        uVar57 = 0;
                                        do {
                                          lVar56 = 0;
                                          do {
                                            auVar89 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                           (lVar77 + lVar56),auVar88
                                                                          ,*(undefined1 (*) [64])
                                                                            (lVar63 + lVar56));
                                            *(undefined1 (*) [64])(lVar63 + lVar56) = auVar89;
                                            lVar56 = lVar56 + 0x40;
                                          } while (lVar56 != 0x100);
                                          uVar57 = uVar57 + 0x40;
                                          lVar63 = lVar63 + 0x100;
                                          lVar77 = lVar77 + 0x100;
                                        } while (uVar57 < uVar79);
                                      }
                                      if (uVar59 != uVar75) {
                                        auVar88 = vbroadcastss_avx512f(auVar88._0_16_);
                                        uVar57 = 0;
                                        lVar63 = lVar71 + uVar73 * 4;
                                        do {
                                          auVar89 = vpbroadcastq_avx512f();
                                          auVar90 = vporq_avx512f(auVar89,auVar83);
                                          auVar89 = vporq_avx512f(auVar89,auVar84);
                                          uVar70 = vpcmpuq_avx512f(auVar89,auVar87,2);
                                          bVar41 = (byte)uVar70;
                                          uVar70 = vpcmpuq_avx512f(auVar90,auVar87,2);
                                          bVar42 = (byte)uVar70;
                                          uVar80 = CONCAT11(bVar42,bVar41);
                                          piVar3 = (int *)((long)pvVar2 + uVar57 * 4 + lVar68);
                                          auVar89._4_4_ =
                                               (uint)((byte)(uVar80 >> 1) & 1) * piVar3[1];
                                          auVar89._0_4_ = (uint)(bVar41 & 1) * *piVar3;
                                          auVar89._8_4_ =
                                               (uint)((byte)(uVar80 >> 2) & 1) * piVar3[2];
                                          auVar89._12_4_ =
                                               (uint)((byte)(uVar80 >> 3) & 1) * piVar3[3];
                                          auVar89._16_4_ =
                                               (uint)((byte)(uVar80 >> 4) & 1) * piVar3[4];
                                          auVar89._20_4_ =
                                               (uint)((byte)(uVar80 >> 5) & 1) * piVar3[5];
                                          auVar89._24_4_ =
                                               (uint)((byte)(uVar80 >> 6) & 1) * piVar3[6];
                                          auVar89._28_4_ =
                                               (uint)((byte)(uVar80 >> 7) & 1) * piVar3[7];
                                          auVar89._32_4_ = (uint)(bVar42 & 1) * piVar3[8];
                                          auVar89._36_4_ = (uint)(bVar42 >> 1 & 1) * piVar3[9];
                                          auVar89._40_4_ = (uint)(bVar42 >> 2 & 1) * piVar3[10];
                                          auVar89._44_4_ = (uint)(bVar42 >> 3 & 1) * piVar3[0xb];
                                          auVar89._48_4_ = (uint)(bVar42 >> 4 & 1) * piVar3[0xc];
                                          auVar89._52_4_ = (uint)(bVar42 >> 5 & 1) * piVar3[0xd];
                                          auVar89._56_4_ = (uint)(bVar42 >> 6 & 1) * piVar3[0xe];
                                          auVar89._60_4_ = (uint)(bVar42 >> 7) * piVar3[0xf];
                                          piVar3 = (int *)((long)pvVar25 + uVar57 * 4 + lVar63);
                                          auVar92._4_4_ =
                                               (uint)((byte)(uVar80 >> 1) & 1) * piVar3[1];
                                          auVar92._0_4_ = (uint)(bVar41 & 1) * *piVar3;
                                          auVar92._8_4_ =
                                               (uint)((byte)(uVar80 >> 2) & 1) * piVar3[2];
                                          auVar92._12_4_ =
                                               (uint)((byte)(uVar80 >> 3) & 1) * piVar3[3];
                                          auVar92._16_4_ =
                                               (uint)((byte)(uVar80 >> 4) & 1) * piVar3[4];
                                          auVar92._20_4_ =
                                               (uint)((byte)(uVar80 >> 5) & 1) * piVar3[5];
                                          auVar92._24_4_ =
                                               (uint)((byte)(uVar80 >> 6) & 1) * piVar3[6];
                                          auVar92._28_4_ =
                                               (uint)((byte)(uVar80 >> 7) & 1) * piVar3[7];
                                          auVar92._32_4_ = (uint)(bVar42 & 1) * piVar3[8];
                                          auVar92._36_4_ = (uint)(bVar42 >> 1 & 1) * piVar3[9];
                                          auVar92._40_4_ = (uint)(bVar42 >> 2 & 1) * piVar3[10];
                                          auVar92._44_4_ = (uint)(bVar42 >> 3 & 1) * piVar3[0xb];
                                          auVar92._48_4_ = (uint)(bVar42 >> 4 & 1) * piVar3[0xc];
                                          auVar92._52_4_ = (uint)(bVar42 >> 5 & 1) * piVar3[0xd];
                                          auVar92._56_4_ = (uint)(bVar42 >> 6 & 1) * piVar3[0xe];
                                          auVar92._60_4_ = (uint)(bVar42 >> 7) * piVar3[0xf];
                                          auVar89 = vfmadd231ps_avx512f(auVar92,auVar88,auVar89);
                                          puVar4 = (uint *)((long)pvVar25 + uVar57 * 4 + lVar63);
                                          bVar28 = (bool)((byte)(uVar80 >> 1) & 1);
                                          bVar29 = (bool)((byte)(uVar80 >> 2) & 1);
                                          bVar30 = (bool)((byte)(uVar80 >> 3) & 1);
                                          bVar31 = (bool)((byte)(uVar80 >> 4) & 1);
                                          bVar32 = (bool)((byte)(uVar80 >> 5) & 1);
                                          bVar33 = (bool)((byte)(uVar80 >> 6) & 1);
                                          bVar34 = (bool)((byte)(uVar80 >> 7) & 1);
                                          bVar35 = (bool)(bVar42 >> 1 & 1);
                                          bVar36 = (bool)(bVar42 >> 2 & 1);
                                          bVar37 = (bool)(bVar42 >> 3 & 1);
                                          bVar38 = (bool)(bVar42 >> 4 & 1);
                                          bVar39 = (bool)(bVar42 >> 5 & 1);
                                          bVar40 = (bool)(bVar42 >> 6 & 1);
                                          *puVar4 = (uint)(bVar41 & 1) * auVar89._0_4_ |
                                                    (uint)!(bool)(bVar41 & 1) * *puVar4;
                                          puVar4[1] = (uint)bVar28 * auVar89._4_4_ |
                                                      (uint)!bVar28 * puVar4[1];
                                          puVar4[2] = (uint)bVar29 * auVar89._8_4_ |
                                                      (uint)!bVar29 * puVar4[2];
                                          puVar4[3] = (uint)bVar30 * auVar89._12_4_ |
                                                      (uint)!bVar30 * puVar4[3];
                                          puVar4[4] = (uint)bVar31 * auVar89._16_4_ |
                                                      (uint)!bVar31 * puVar4[4];
                                          puVar4[5] = (uint)bVar32 * auVar89._20_4_ |
                                                      (uint)!bVar32 * puVar4[5];
                                          puVar4[6] = (uint)bVar33 * auVar89._24_4_ |
                                                      (uint)!bVar33 * puVar4[6];
                                          puVar4[7] = (uint)bVar34 * auVar89._28_4_ |
                                                      (uint)!bVar34 * puVar4[7];
                                          puVar4[8] = (uint)(bVar42 & 1) * auVar89._32_4_ |
                                                      (uint)!(bool)(bVar42 & 1) * puVar4[8];
                                          puVar4[9] = (uint)bVar35 * auVar89._36_4_ |
                                                      (uint)!bVar35 * puVar4[9];
                                          puVar4[10] = (uint)bVar36 * auVar89._40_4_ |
                                                       (uint)!bVar36 * puVar4[10];
                                          puVar4[0xb] = (uint)bVar37 * auVar89._44_4_ |
                                                        (uint)!bVar37 * puVar4[0xb];
                                          puVar4[0xc] = (uint)bVar38 * auVar89._48_4_ |
                                                        (uint)!bVar38 * puVar4[0xc];
                                          puVar4[0xd] = (uint)bVar39 * auVar89._52_4_ |
                                                        (uint)!bVar39 * puVar4[0xd];
                                          puVar4[0xe] = (uint)bVar40 * auVar89._56_4_ |
                                                        (uint)!bVar40 * puVar4[0xe];
                                          puVar4[0xf] = (uint)(bVar42 >> 7) * auVar89._60_4_ |
                                                        (uint)!(bool)(bVar42 >> 7) * puVar4[0xf];
                                          uVar57 = uVar57 + 0x10;
                                        } while (((lVar46 - uVar73) + 0xf & 0xfffffffffffffff0) !=
                                                 uVar57);
                                      }
                                      uVar69 = uVar69 + 1;
                                      lVar64 = lVar64 + sVar11;
                                      lVar68 = lVar68 + sVar11;
                                    } while ((long)uVar69 < (long)uVar50);
                                  }
                                  lVar48 = lVar48 + 1;
                                } while (lVar48 < lVar43);
                                uVar49 = uVar49 + 0x20;
                                uVar55 = uVar1;
                              } while ((long)uVar1 < (long)uVar60);
                            }
                            lVar72 = lVar54;
                          } while (lVar54 < lVar52);
                          return;
                        }
                        pcVar58 = "nb0 == sizeof(float)";
                        uVar70 = 0xe19;
                      }
                      else {
                        pcVar58 = "nb00 == sizeof(float)";
                        uVar70 = 0xe16;
                      }
                    }
                    else {
                      pcVar58 = "ne3 % ne03 == 0";
                      uVar70 = 0xe13;
                    }
                  }
                  else {
                    pcVar58 = "ne2 % ne02 == 0";
                    uVar70 = 0xe12;
                  }
                }
                else {
                  pcVar58 = "ne3 == ne13";
                  uVar70 = 0xe10;
                }
              }
              else {
                pcVar58 = "ne2 == ne12";
                uVar70 = 0xe0f;
              }
            }
            else {
              pcVar58 = "ne1 == ne10";
              uVar70 = 0xe0e;
            }
          }
          else {
            pcVar58 = "ne0 == ne00";
            uVar70 = 0xe0d;
          }
        }
        else {
          pcVar58 = "src1->type == GGML_TYPE_F32";
          uVar70 = 0xe08;
        }
      }
      else {
        pcVar58 = "dst->type == GGML_TYPE_F32";
        uVar70 = 0xe06;
      }
      goto LAB_0013c11f;
    }
    if (uVar60 == 1) {
      uVar70 = 0xef0;
      goto LAB_0013c288;
    }
  }
  uVar70 = 0xef9;
LAB_0013c288:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar70,"fatal error");
}

Assistant:

void ggml_compute_forward_out_prod(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_out_prod_q_f32(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ABORT("fatal error"); // todo
                // ggml_compute_forward_out_prod_f16_f32(params, dst);
            }
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_out_prod_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}